

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.h
# Opt level: O1

void __thiscall ASDCP::MXF::Preface::~Preface(Preface *this)

{
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Preface_00223fa8;
  std::
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  ::~_Rb_tree(&(this->ConformsToSpecifications).m_property.
               super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t);
  std::
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  ::~_Rb_tree(&(this->ApplicationSchemes).m_property.
               super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t);
  std::
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  ::~_Rb_tree(&(this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t);
  std::
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  ::~_Rb_tree(&(this->EssenceContainers).
               super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t);
  std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::~vector
            (&(this->Identifications).
              super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
              super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>);
  Kumu::Timestamp::~Timestamp(&this->LastModifiedDate);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__InterchangeObject_00224210;
  return;
}

Assistant:

virtual ~Preface() {}